

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  xmlInputReadCallback p_Var1;
  void *pvVar2;
  int iVar3;
  xmlBufPtr pxVar4;
  xmlChar *pxVar5;
  size_t local_30;
  size_t sizeOut;
  xmlBufPtr buf;
  int res;
  int len_local;
  xmlParserInputBufferPtr in_local;
  
  buf._0_4_ = 0;
  if ((in == (xmlParserInputBufferPtr)0x0) || (in->error != 0)) {
    return -1;
  }
  buf._4_4_ = len;
  if (len < 4000) {
    buf._4_4_ = 4000;
  }
  _res = in;
  if (in->readcallback != (xmlInputReadCallback)0x0) {
    if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      sizeOut = (size_t)in->buffer;
    }
    else {
      if (in->raw == (xmlBufPtr)0x0) {
        pxVar4 = xmlBufCreate(6000);
        _res->raw = pxVar4;
        if (_res->raw == (xmlBufPtr)0x0) {
          _res->error = 2;
          return -1;
        }
      }
      sizeOut = (size_t)_res->raw;
    }
    iVar3 = xmlBufGrow((xmlBufPtr)sizeOut,(long)buf._4_4_);
    if (iVar3 < 0) {
      _res->error = 2;
      return -1;
    }
    p_Var1 = _res->readcallback;
    pvVar2 = _res->context;
    pxVar5 = xmlBufEnd((xmlBufPtr)sizeOut);
    buf._0_4_ = (*p_Var1)(pvVar2,(char *)pxVar5,buf._4_4_);
    if ((int)buf < 1) {
      _res->readcallback = endOfInput;
    }
    if ((int)buf < 0) {
      if ((int)buf == -1) {
        _res->error = 0x5dc;
      }
      else {
        _res->error = -(int)buf;
      }
      return -1;
    }
    iVar3 = xmlBufAddLen((xmlBufPtr)sizeOut,(long)(int)buf);
    if (iVar3 < 0) {
      _res->error = 2;
      return -1;
    }
  }
  if (_res->encoder != (xmlCharEncodingHandlerPtr)0x0) {
    if (_res->readcallback == (xmlInputReadCallback)0x0) {
      local_30 = (size_t)buf._4_4_;
    }
    else {
      local_30 = 0xffffffffffffffff;
    }
    iVar3 = xmlCharEncInput(_res,&local_30);
    if (iVar3 < 0) {
      return -1;
    }
    buf._0_4_ = (int)local_30;
  }
  return (int)buf;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    int res = 0;

    if ((in == NULL) || (in->error))
        return(-1);

    if (len < MINLEN)
        len = MINLEN;

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
        xmlBufPtr buf;

        if (in->encoder == NULL) {
            buf = in->buffer;
        } else {
            /*
             * Some users only set 'encoder' and expect us to create
             * the raw buffer lazily.
             */
            if (in->raw == NULL) {
                in->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
                if (in->raw == NULL) {
                    in->error = XML_ERR_NO_MEMORY;
                    return(-1);
                }
            }
            buf = in->raw;
        }

        if (xmlBufGrow(buf, len) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

	res = in->readcallback(in->context, (char *)xmlBufEnd(buf), len);
	if (res <= 0)
	    in->readcallback = endOfInput;
        if (res < 0) {
            if (res == -1)
                in->error = XML_IO_UNKNOWN;
            else
                in->error = -res;
            return(-1);
        }

        if (xmlBufAddLen(buf, res) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
    }

    /*
     * Handle encoding.
     */
    if (in->encoder != NULL) {
        size_t sizeOut;

        /*
         * Don't convert whole buffer when reading from memory.
         */
        if (in->readcallback == NULL)
            sizeOut = len;
        else
            sizeOut = SIZE_MAX;

	if (xmlCharEncInput(in, &sizeOut) < 0)
	    return(-1);
        res = sizeOut;
    }
    return(res);
}